

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::FString(FString *this,char *head,char *tail)

{
  char *pcVar1;
  size_t __n;
  size_t __n_00;
  
  __n = strlen(head);
  __n_00 = strlen(tail);
  AllocBuffer(this,__n_00 + __n);
  pcVar1 = this->Chars;
  memcpy(pcVar1,head,__n);
  pcVar1[__n] = '\0';
  pcVar1 = this->Chars;
  memcpy(pcVar1 + __n,tail,__n_00);
  (pcVar1 + __n)[__n_00] = '\0';
  return;
}

Assistant:

FString::FString (const char *head, const char *tail)
{
	size_t len1 = strlen (head);
	size_t len2 = strlen (tail);
	AllocBuffer (len1 + len2);
	StrCopy (Chars, head, len1);
	StrCopy (Chars + len1, tail, len2);
}